

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
sort_fn<std::greater<void>>::operator()
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          sort_fn<std::greater<void>> *this,vector<int,_std::allocator<int>_> *c)

{
  long lVar1;
  ulong uVar2;
  pointer piVar3;
  pointer piVar4;
  
  piVar3 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 != piVar4) {
    uVar2 = (long)piVar4 - (long)piVar3 >> 2;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (piVar3,piVar4,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (piVar3,piVar4);
    piVar3 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar4 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar3;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar4;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c) const
    {
        std::sort(c.begin(), c.end(), compare);
        return c;
    }